

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_int64.c
# Opt level: O0

int uint32_c2i(ASN1_VALUE **pval,uchar *cont,int len,int utype,char *free_cont,ASN1_ITEM *it)

{
  int iVar1;
  int in_EDX;
  long *in_RDI;
  long in_R9;
  int neg;
  char *cp;
  uint32_t utmp2;
  uint64_t utmp;
  ASN1_VALUE **in_stack_ffffffffffffffa8;
  undefined4 in_stack_ffffffffffffffb0;
  int iVar2;
  uchar **pp;
  undefined4 in_stack_ffffffffffffffc0;
  undefined4 uVar3;
  uint64_t *ret;
  
  ret = (uint64_t *)0x0;
  uVar3 = 0;
  iVar2 = 0;
  if ((*in_RDI == 0) &&
     (iVar1 = uint64_new(in_stack_ffffffffffffffa8,(ASN1_ITEM *)0x385a53), iVar1 == 0)) {
    return 0;
  }
  pp = (uchar **)*in_RDI;
  if (in_EDX != 0) {
    iVar1 = ossl_c2i_uint64_int(ret,(int *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),pp,
                                CONCAT44(iVar2,in_stack_ffffffffffffffb0));
    if (iVar1 == 0) {
      return 0;
    }
    if (((*(ulong *)(in_R9 + 0x28) & 2) == 0) && (iVar2 != 0)) {
      ERR_new();
      ERR_set_debug((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),(int)((ulong)pp >> 0x20),
                    (char *)CONCAT44(iVar2,in_stack_ffffffffffffffb0));
      ERR_set_error(0xd,0xe2,(char *)0x0);
      return 0;
    }
    if (iVar2 == 0) {
      if ((((*(ulong *)(in_R9 + 0x28) & 2) != 0) && ((uint64_t *)0x7fffffff < ret)) ||
         (((*(ulong *)(in_R9 + 0x28) & 2) == 0 && ((uint64_t *)0xffffffff < ret)))) {
        ERR_new();
        ERR_set_debug((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),(int)((ulong)pp >> 0x20),
                      (char *)CONCAT44(iVar2,in_stack_ffffffffffffffb0));
        ERR_set_error(0xd,0xdf,(char *)0x0);
        return 0;
      }
    }
    else {
      if ((uint64_t *)0x80000000 < ret) {
        ERR_new();
        ERR_set_debug((char *)CONCAT44(uVar3,in_stack_ffffffffffffffc0),(int)((ulong)pp >> 0x20),
                      (char *)CONCAT44(iVar2,in_stack_ffffffffffffffb0));
        ERR_set_error(0xd,0xe0,(char *)0x0);
        return 0;
      }
      ret = (uint64_t *)-(long)ret;
    }
  }
  *(int *)pp = (int)ret;
  return 1;
}

Assistant:

static int uint32_c2i(ASN1_VALUE **pval, const unsigned char *cont, int len,
                      int utype, char *free_cont, const ASN1_ITEM *it)
{
    uint64_t utmp = 0;
    uint32_t utmp2 = 0;
    char *cp;
    int neg = 0;

    if (*pval == NULL && !uint64_new(pval, it))
        return 0;

    cp = (char *)*pval;

    /*
     * Strictly speaking, zero length is malformed.  However, long_c2i
     * (x_long.c) encodes 0 as a zero length INTEGER (wrongly, of course),
     * so for the sake of backward compatibility, we still decode zero
     * length INTEGERs as the number zero.
     */
    if (len == 0)
        goto long_compat;

    if (!ossl_c2i_uint64_int(&utmp, &neg, &cont, len))
        return 0;
    if ((it->size & INTxx_FLAG_SIGNED) == 0 && neg) {
        ERR_raise(ERR_LIB_ASN1, ASN1_R_ILLEGAL_NEGATIVE_VALUE);
        return 0;
    }
    if (neg) {
        if (utmp > ABS_INT32_MIN) {
            ERR_raise(ERR_LIB_ASN1, ASN1_R_TOO_SMALL);
            return 0;
        }
        utmp = 0 - utmp;
    } else {
        if (((it->size & INTxx_FLAG_SIGNED) != 0 && utmp > INT32_MAX)
            || ((it->size & INTxx_FLAG_SIGNED) == 0 && utmp > UINT32_MAX)) {
            ERR_raise(ERR_LIB_ASN1, ASN1_R_TOO_LARGE);
            return 0;
        }
    }

 long_compat:
    utmp2 = (uint32_t)utmp;
    memcpy(cp, &utmp2, sizeof(utmp2));
    return 1;
}